

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_msa_ld_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,target_ulong addr)

{
  uint idx;
  TCGMemOpIdx oi_00;
  fpr_t *pfVar1;
  tcg_target_ulong tVar2;
  uintptr_t unaff_retaddr;
  TCGMemOpIdx oi;
  wr_t *pwd;
  target_ulong addr_local;
  uint32_t wd_local;
  CPUMIPSState_conflict5 *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  idx = cpu_mmu_index(env,false);
  oi_00 = make_memop_idx(MO_AMASK|MO_BE,idx);
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr,oi_00,unaff_retaddr);
  *(char *)pfVar1 = (char)tVar2;
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr + 1,oi_00,unaff_retaddr);
  *(char *)((long)pfVar1 + 1) = (char)tVar2;
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr + 2,oi_00,unaff_retaddr);
  *(char *)((long)pfVar1 + 2) = (char)tVar2;
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr + 3,oi_00,unaff_retaddr);
  *(char *)((long)pfVar1 + 3) = (char)tVar2;
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr + 4,oi_00,unaff_retaddr);
  *(char *)((long)pfVar1 + 4) = (char)tVar2;
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr + 5,oi_00,unaff_retaddr);
  *(char *)((long)pfVar1 + 5) = (char)tVar2;
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr + 6,oi_00,unaff_retaddr);
  *(char *)((long)pfVar1 + 6) = (char)tVar2;
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr + 7,oi_00,unaff_retaddr);
  *(char *)((long)pfVar1 + 7) = (char)tVar2;
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr + 8,oi_00,unaff_retaddr);
  *(char *)((long)pfVar1 + 8) = (char)tVar2;
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr + 9,oi_00,unaff_retaddr);
  *(char *)((long)pfVar1 + 9) = (char)tVar2;
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr + 10,oi_00,unaff_retaddr);
  *(char *)((long)pfVar1 + 10) = (char)tVar2;
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr + 0xb,oi_00,unaff_retaddr);
  *(char *)((long)pfVar1 + 0xb) = (char)tVar2;
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr + 0xc,oi_00,unaff_retaddr);
  *(char *)((long)pfVar1 + 0xc) = (char)tVar2;
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr + 0xd,oi_00,unaff_retaddr);
  *(char *)((long)pfVar1 + 0xd) = (char)tVar2;
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr + 0xe,oi_00,unaff_retaddr);
  *(char *)((long)pfVar1 + 0xe) = (char)tVar2;
  tVar2 = helper_ret_ldub_mmu_mips64((CPUArchState_conflict10 *)env,addr + 0xf,oi_00,unaff_retaddr);
  *(char *)((long)pfVar1 + 0xf) = (char)tVar2;
  return;
}

Assistant:

void helper_msa_ld_b(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    MEMOP_IDX(DF_BYTE)
#if !defined(HOST_WORDS_BIGENDIAN)
    pwd->b[0]  = helper_ret_ldub_mmu(env, addr + (0  << DF_BYTE), oi, GETPC());
    pwd->b[1]  = helper_ret_ldub_mmu(env, addr + (1  << DF_BYTE), oi, GETPC());
    pwd->b[2]  = helper_ret_ldub_mmu(env, addr + (2  << DF_BYTE), oi, GETPC());
    pwd->b[3]  = helper_ret_ldub_mmu(env, addr + (3  << DF_BYTE), oi, GETPC());
    pwd->b[4]  = helper_ret_ldub_mmu(env, addr + (4  << DF_BYTE), oi, GETPC());
    pwd->b[5]  = helper_ret_ldub_mmu(env, addr + (5  << DF_BYTE), oi, GETPC());
    pwd->b[6]  = helper_ret_ldub_mmu(env, addr + (6  << DF_BYTE), oi, GETPC());
    pwd->b[7]  = helper_ret_ldub_mmu(env, addr + (7  << DF_BYTE), oi, GETPC());
    pwd->b[8]  = helper_ret_ldub_mmu(env, addr + (8  << DF_BYTE), oi, GETPC());
    pwd->b[9]  = helper_ret_ldub_mmu(env, addr + (9  << DF_BYTE), oi, GETPC());
    pwd->b[10] = helper_ret_ldub_mmu(env, addr + (10 << DF_BYTE), oi, GETPC());
    pwd->b[11] = helper_ret_ldub_mmu(env, addr + (11 << DF_BYTE), oi, GETPC());
    pwd->b[12] = helper_ret_ldub_mmu(env, addr + (12 << DF_BYTE), oi, GETPC());
    pwd->b[13] = helper_ret_ldub_mmu(env, addr + (13 << DF_BYTE), oi, GETPC());
    pwd->b[14] = helper_ret_ldub_mmu(env, addr + (14 << DF_BYTE), oi, GETPC());
    pwd->b[15] = helper_ret_ldub_mmu(env, addr + (15 << DF_BYTE), oi, GETPC());
#else
    pwd->b[0]  = helper_ret_ldub_mmu(env, addr + (7  << DF_BYTE), oi, GETPC());
    pwd->b[1]  = helper_ret_ldub_mmu(env, addr + (6  << DF_BYTE), oi, GETPC());
    pwd->b[2]  = helper_ret_ldub_mmu(env, addr + (5  << DF_BYTE), oi, GETPC());
    pwd->b[3]  = helper_ret_ldub_mmu(env, addr + (4  << DF_BYTE), oi, GETPC());
    pwd->b[4]  = helper_ret_ldub_mmu(env, addr + (3  << DF_BYTE), oi, GETPC());
    pwd->b[5]  = helper_ret_ldub_mmu(env, addr + (2  << DF_BYTE), oi, GETPC());
    pwd->b[6]  = helper_ret_ldub_mmu(env, addr + (1  << DF_BYTE), oi, GETPC());
    pwd->b[7]  = helper_ret_ldub_mmu(env, addr + (0  << DF_BYTE), oi, GETPC());
    pwd->b[8]  = helper_ret_ldub_mmu(env, addr + (15 << DF_BYTE), oi, GETPC());
    pwd->b[9]  = helper_ret_ldub_mmu(env, addr + (14 << DF_BYTE), oi, GETPC());
    pwd->b[10] = helper_ret_ldub_mmu(env, addr + (13 << DF_BYTE), oi, GETPC());
    pwd->b[11] = helper_ret_ldub_mmu(env, addr + (12 << DF_BYTE), oi, GETPC());
    pwd->b[12] = helper_ret_ldub_mmu(env, addr + (11 << DF_BYTE), oi, GETPC());
    pwd->b[13] = helper_ret_ldub_mmu(env, addr + (10 << DF_BYTE), oi, GETPC());
    pwd->b[14] = helper_ret_ldub_mmu(env, addr + (9  << DF_BYTE), oi, GETPC());
    pwd->b[15] = helper_ret_ldub_mmu(env, addr + (8  << DF_BYTE), oi, GETPC());
#endif
}